

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

string_view __thiscall RenX::Server::getPrefix(Server *this)

{
  string_view sVar1;
  
  if (getPrefix()::parsed_abi_cxx11_ == '\0') {
    getPrefix();
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&getPrefix()::parsed_abi_cxx11_,&this->m_IRCPrefix);
  processTags(&getPrefix()::parsed_abi_cxx11_,this,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
              (BuildingInfo *)0x0);
  sVar1._M_str = getPrefix()::parsed_abi_cxx11_._M_dataplus._M_p;
  sVar1._M_len = getPrefix()::parsed_abi_cxx11_._M_string_length;
  return sVar1;
}

Assistant:

std::string_view RenX::Server::getPrefix() const {
	static std::string parsed; // TODO: What the hell?
	RenX::processTags(parsed = m_IRCPrefix, this);
	return parsed;
}